

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Remove(BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this,uint *key)

{
  int iVar1;
  Type piVar2;
  Type pSVar3;
  undefined8 in_RAX;
  uint depth;
  uint unaff_R13D;
  uint uVar4;
  bool bVar5;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  piVar2 = this->buckets;
  depth = 0;
  if (piVar2 == (Type)0x0) {
    uVar4 = 0;
  }
  else {
    local_34 = GetBucket(*key * 2 + 1,this->bucketCount,this->modFunctionIndex);
    unaff_R13D = piVar2[local_34];
    if (-1 < (long)(int)unaff_R13D) {
      pSVar3 = this->entries;
      if (pSVar3[(int)unaff_R13D].
          super_DefaultHashedEntry<unsigned_int,_Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .super_KeyValueEntry<unsigned_int,_Js::DynamicProfileInfo_*>.
          super_ValueEntry<Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>_>
          .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>.key == *key) {
        depth = 0;
        uVar4 = 0xffffffff;
      }
      else {
        depth = 0;
        do {
          uVar4 = unaff_R13D;
          depth = depth + 1;
          unaff_R13D = pSVar3[uVar4].
                       super_DefaultHashedEntry<unsigned_int,_Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                       .super_KeyValueEntry<unsigned_int,_Js::DynamicProfileInfo_*>.
                       super_ValueEntry<Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>_>
                       .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>.next;
          if ((long)(int)unaff_R13D < 0) goto LAB_00b0ec47;
        } while (pSVar3[(int)unaff_R13D].
                 super_DefaultHashedEntry<unsigned_int,_Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .super_KeyValueEntry<unsigned_int,_Js::DynamicProfileInfo_*>.
                 super_ValueEntry<Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>_>
                 .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>.key != *key
                );
      }
      bVar5 = true;
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(this->stats,depth);
      }
      goto LAB_00b0ec5b;
    }
    uVar4 = 0xffffffff;
  }
LAB_00b0ec47:
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,depth);
  }
  bVar5 = false;
LAB_00b0ec5b:
  if (bVar5 != false) {
    iVar1 = this->entries[(int)unaff_R13D].
            super_DefaultHashedEntry<unsigned_int,_Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_int,_Js::DynamicProfileInfo_*>.
            super_ValueEntry<Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>_>
            .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>.next;
    if ((int)uVar4 < 0) {
      this->buckets[local_34] = iVar1;
    }
    else {
      this->entries[uVar4].
      super_DefaultHashedEntry<unsigned_int,_Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      .super_KeyValueEntry<unsigned_int,_Js::DynamicProfileInfo_*>.
      super_ValueEntry<Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>_>
      .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>.next = iVar1;
    }
    pSVar3 = this->entries;
    pSVar3[(int)unaff_R13D].
    super_DefaultHashedEntry<unsigned_int,_Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
    .super_KeyValueEntry<unsigned_int,_Js::DynamicProfileInfo_*>.
    super_ValueEntry<Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>_>
    .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>.value =
         (DynamicProfileInfo *)0x0;
    pSVar3[(int)unaff_R13D].
    super_DefaultHashedEntry<unsigned_int,_Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
    .super_KeyValueEntry<unsigned_int,_Js::DynamicProfileInfo_*>.
    super_ValueEntry<Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>_>
    .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>.key = 0;
    SetNextFreeEntryIndex
              (this,this->entries + (int)unaff_R13D,-(uint)(this->freeCount == 0) | this->freeList);
    this->freeList = unaff_R13D;
    this->freeCount = this->freeCount + 1;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Remove(this->stats,this->buckets[local_34] == -1);
    }
  }
  return bVar5;
}

Assistant:

bool Remove(const TKey& key)
        {
            int i, last;
            uint targetBucket;
            if(FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }